

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_StringOptionEquals_Test::TestBody(ClCommandLine_StringOptionEquals_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *in_R9;
  AssertHelper local_530;
  Message local_528;
  uint local_520;
  uint local_51c;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_3;
  Message local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_2;
  Message local_4e0;
  uint local_4d4;
  string local_4d0 [32];
  unsigned_long local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_1;
  Message local_490;
  uint local_484;
  string local_480 [32];
  unsigned_long local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar;
  AssertHelper local_428;
  Message local_420;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_;
  string_stream errors;
  ostringstream local_288 [8];
  string_stream output;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option;
  ClCommandLine_StringOptionEquals_Test *this_local;
  
  option.parser_.super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[4]>((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)local_d8,(char (*) [4])0x1e21b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"progname",&local_f9);
  (anonymous_namespace)::ClCommandLine::add<char_const*>
            ((ClCommandLine *)this,&local_f8,"--arg=value");
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::ostringstream::ostringstream(local_288);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gtest_ar_.message_);
  local_411 = anon_unknown.dwarf_19dfa::ClCommandLine::parse_command_line_options
                        (&this->super_ClCommandLine,(string_stream *)local_288,
                         (string_stream *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_410,&local_411,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_410,
               (AssertionResult *)"this->parse_command_line_options (output, errors)","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_428,&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_428);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::__cxx11::ostringstream::str();
  local_460 = std::__cxx11::string::length();
  local_484 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_458,"errors.str ().length ()","0U",&local_460,&local_484);
  std::__cxx11::string::~string(local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  std::__cxx11::ostringstream::str();
  local_4b0 = std::__cxx11::string::length();
  local_4d4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_4a8,"output.str ().length ()","0U",&local_4b0,&local_4d4);
  std::__cxx11::string::~string(local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  lhs = pstore::command_line::
        opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
        ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
               *)local_d8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_4f8,"option.get ()","\"value\"",lhs,(char (*) [6])0x1e254c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_51c = pstore::command_line::option::get_num_occurrences((option *)local_d8);
  local_520 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_518,"option.get_num_occurrences ()","1U",&local_51c,&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gtest_ar_.message_);
  std::__cxx11::ostringstream::~ostringstream(local_288);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)local_d8);
  return;
}

Assistant:

TEST_F (ClCommandLine, StringOptionEquals) {
    opt<std::string> option ("arg");
    this->add ("progname", "--arg=value");

    string_stream output;
    string_stream errors;
    EXPECT_TRUE (this->parse_command_line_options (output, errors));

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "value");
    EXPECT_EQ (option.get_num_occurrences (), 1U);
}